

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Render(void)

{
  int *piVar1;
  ImVec2 IVar2;
  uint uVar3;
  ImGuiContextHook *pIVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow_conflict *window;
  undefined1 auVar6 [16];
  ImGuiContext_conflict1 *pIVar7;
  ImGuiContext_conflict1 *pIVar8;
  bool bVar9;
  undefined4 extraout_EAX;
  int iVar10;
  ulong uVar11;
  ImDrawList *pIVar12;
  int iVar13;
  char *__function;
  int iVar14;
  ImGuiContext_conflict1 *g;
  bool bVar15;
  ImDrawList **ppIVar16;
  ulong uVar17;
  long lVar18;
  ImGuiWindow_conflict *pIVar19;
  long lVar20;
  ImGuiWindow_conflict *pIVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  ImVec2 mouse_cursor_uv [4];
  ImVec2 local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar7 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1297,"void ImGui::Render()");
  }
  iVar10 = GImGui->FrameCountEnded;
  if (iVar10 != GImGui->FrameCount) {
    EndFrame();
    iVar10 = pIVar7->FrameCount;
  }
  pIVar7->FrameCountRendered = iVar10;
  (pIVar7->IO).MetricsRenderWindows = 0;
  iVar10 = (pIVar7->Hooks).Size;
  if (0 < iVar10) {
    lVar18 = 0;
    lVar20 = 0;
    do {
      pIVar4 = (pIVar7->Hooks).Data;
      if (*(int *)((long)&pIVar4->Type + lVar18) == 4) {
        (**(code **)((long)&pIVar4->Callback + lVar18))(pIVar7);
        iVar10 = (pIVar7->Hooks).Size;
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar20 < iVar10);
  }
  uVar3 = (pIVar7->Viewports).Size;
  uVar11 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar17 = 0;
    do {
      if ((long)(int)uVar11 <= (long)uVar17) {
        __function = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
        goto LAB_00191ba3;
      }
      pIVar5 = (pIVar7->Viewports).Data[uVar17];
      ImDrawDataBuilder::Clear(&pIVar5->DrawDataBuilder);
      if (pIVar5->DrawLists[0] != (ImDrawList *)0x0) {
        pIVar12 = GetViewportDrawList((ImGuiViewportP_conflict1 *)pIVar5,0,"##Background");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar12);
      }
      uVar17 = uVar17 + 1;
      uVar11 = (ulong)(uint)(pIVar7->Viewports).Size;
    } while (uVar17 != uVar11);
  }
  pIVar19 = pIVar7->NavWindowingTarget;
  if (pIVar19 == (ImGuiWindow_conflict *)0x0) {
    pIVar19 = (ImGuiWindow_conflict *)0x0;
    pIVar21 = (ImGuiWindow_conflict *)0x0;
  }
  else {
    if ((pIVar19->Flags & 0x2000) == 0) {
      pIVar19 = pIVar19->RootWindowDockTree;
    }
    else {
      pIVar19 = (ImGuiWindow_conflict *)0x0;
    }
    pIVar21 = pIVar7->NavWindowingListWindow;
  }
  uVar3 = (pIVar7->Windows).Size;
  uVar11 = (ulong)uVar3;
  if (uVar3 != 0) {
    uVar17 = 0;
    do {
      if ((long)(int)uVar11 <= (long)uVar17) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_00191ba3:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x706,__function);
      }
      window = (pIVar7->Windows).Data[uVar17];
      if ((window->Active == true) && (window->Hidden == false)) {
        if ((window != pIVar21 && window != pIVar19) && (window->Flags & 0x1000000U) == 0) {
          AddWindowToDrawData(window,(uint)window->Flags >> 0x19 & 1);
          uVar11 = (ulong)(uint)(pIVar7->Windows).Size;
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar11);
  }
  bVar9 = true;
  do {
    bVar15 = bVar9;
    if (((pIVar19 != (ImGuiWindow_conflict *)0x0) && (pIVar19->Active == true)) &&
       (pIVar19->Hidden == false)) {
      AddWindowToDrawData(pIVar19,(uint)pIVar19->Flags >> 0x19 & 1);
    }
    pIVar19 = pIVar21;
    bVar9 = false;
  } while (bVar15);
  local_70.x = 0.0;
  local_70.y = 0.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_48.x = 0.0;
  local_48.y = 0.0;
  uStack_40 = 0;
  local_58.x = 0.0;
  local_58.y = 0.0;
  uStack_50 = 0;
  if (((pIVar7->IO).MouseDrawCursor != false) && (pIVar7->MouseCursor != -1)) {
    ImFontAtlas::GetMouseCursorTexData
              ((pIVar7->IO).Fonts,pIVar7->MouseCursor,&local_70,&local_78,&local_58,&local_48);
  }
  (pIVar7->IO).MetricsRenderVertices = 0;
  (pIVar7->IO).MetricsRenderIndices = 0;
  if (0 < (pIVar7->Viewports).Size) {
    lVar18 = 0;
    do {
      pIVar5 = (pIVar7->Viewports).Data[lVar18];
      ImDrawDataBuilder::FlattenIntoSingleLayer(&pIVar5->DrawDataBuilder);
      if ((0.0 < local_78.x) && (0.0 < local_78.y)) {
        fVar26 = (pIVar7->Style).MouseCursorScale * (pIVar5->super_ImGuiViewport).DpiScale;
        IVar2 = (pIVar5->super_ImGuiViewport).Pos;
        fVar24 = IVar2.x;
        fVar25 = IVar2.y;
        IVar2 = (pIVar7->IO).MousePos;
        fVar22 = IVar2.x;
        fVar23 = IVar2.y;
        auVar6._4_4_ = -(uint)(fVar25 < fVar23 + fVar26 * (local_78.y + 2.0));
        auVar6._0_4_ = -(uint)(fVar24 < fVar22 + fVar26 * (local_78.x + 2.0));
        auVar6._8_4_ = -(uint)(fVar22 < fVar24 + (pIVar5->super_ImGuiViewport).Size.x);
        auVar6._12_4_ = -(uint)(fVar23 < (pIVar5->super_ImGuiViewport).Size.y + fVar25);
        iVar10 = movmskps(extraout_EAX,auVar6);
        if (iVar10 == 0xf) {
          local_68 = ZEXT416((uint)fVar26);
          pIVar12 = GetViewportDrawList((ImGuiViewportP_conflict1 *)pIVar5,1,"##Foreground");
          RenderMouseCursor(pIVar12,(pIVar7->IO).MousePos,(float)local_68._0_4_,pIVar7->MouseCursor,
                            0xffffffff,0xff000000,0x30000000);
        }
      }
      if (pIVar5->DrawLists[1] != (ImDrawList *)0x0) {
        pIVar12 = GetViewportDrawList((ImGuiViewportP_conflict1 *)pIVar5,1,"##Foreground");
        AddDrawListToDrawData((pIVar5->DrawDataBuilder).Layers,pIVar12);
      }
      pIVar8 = GImGui;
      if (GImGui == (ImGuiContext_conflict1 *)0x0) {
        __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0xdd6,"ImGuiIO &ImGui::GetIO()");
      }
      uVar3 = (pIVar5->super_ImGuiViewport).Flags;
      (pIVar5->super_ImGuiViewport).DrawData = &pIVar5->DrawDataP;
      (pIVar5->DrawDataP).Valid = true;
      iVar10 = (pIVar5->DrawDataBuilder).Layers[0].Size;
      if ((long)iVar10 < 1) {
        ppIVar16 = (ImDrawList **)0x0;
      }
      else {
        ppIVar16 = (pIVar5->DrawDataBuilder).Layers[0].Data;
      }
      (pIVar5->DrawDataP).CmdLists = ppIVar16;
      (pIVar5->DrawDataP).CmdListsCount = iVar10;
      (pIVar5->DrawDataP).TotalIdxCount = 0;
      (pIVar5->DrawDataP).TotalVtxCount = 0;
      (pIVar5->DrawDataP).DisplayPos = (pIVar5->super_ImGuiViewport).Pos;
      fVar22 = 0.0;
      fVar23 = 0.0;
      if ((uVar3 >> 10 & 1) == 0) {
        IVar2 = (pIVar5->super_ImGuiViewport).Size;
        fVar22 = IVar2.x;
        fVar23 = IVar2.y;
      }
      IVar2.y = fVar23;
      IVar2.x = fVar22;
      (pIVar5->DrawDataP).DisplaySize = IVar2;
      (pIVar5->DrawDataP).FramebufferScale = (pIVar8->IO).DisplayFramebufferScale;
      (pIVar5->DrawDataP).OwnerViewport = &pIVar5->super_ImGuiViewport;
      if (iVar10 < 1) {
        iVar13 = 0;
        iVar14 = 0;
      }
      else {
        lVar20 = 0;
        iVar13 = 0;
        iVar14 = 0;
        do {
          pIVar12 = (pIVar5->DrawDataBuilder).Layers[0].Data[lVar20];
          iVar14 = iVar14 + (pIVar12->VtxBuffer).Size;
          iVar13 = iVar13 + (pIVar12->IdxBuffer).Size;
          lVar20 = lVar20 + 1;
        } while (iVar10 != lVar20);
        (pIVar5->DrawDataP).TotalVtxCount = iVar14;
        (pIVar5->DrawDataP).TotalIdxCount = iVar13;
      }
      piVar1 = &(pIVar7->IO).MetricsRenderVertices;
      *piVar1 = *piVar1 + iVar14;
      piVar1 = &(pIVar7->IO).MetricsRenderIndices;
      *piVar1 = *piVar1 + iVar13;
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pIVar7->Viewports).Size);
  }
  iVar10 = (pIVar7->Hooks).Size;
  if (0 < iVar10) {
    lVar18 = 0;
    lVar20 = 0;
    do {
      pIVar4 = (pIVar7->Hooks).Data;
      if (*(int *)((long)&pIVar4->Type + lVar18) == 5) {
        (**(code **)((long)&pIVar4->Callback + lVar18))(pIVar7,(long)&pIVar4->HookId + lVar18);
        iVar10 = (pIVar7->Hooks).Size;
      }
      lVar20 = lVar20 + 1;
      lVar18 = lVar18 + 0x20;
    } while (lVar20 < iVar10);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList (for each active viewport)
    for (int n = 0; n != g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.Clear();
        if (viewport->DrawLists[0] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetBackgroundDrawList(viewport));
    }

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindowDockTree : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        IM_MSVC_WARNING_SUPPRESS(6011); // Static Analysis false positive "warning C6011: Dereferencing NULL pointer 'window'"
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);

    ImVec2 mouse_cursor_offset, mouse_cursor_size, mouse_cursor_uv[4];
    if (g.IO.MouseDrawCursor && g.MouseCursor != ImGuiMouseCursor_None)
        g.IO.Fonts->GetMouseCursorTexData(g.MouseCursor, &mouse_cursor_offset, &mouse_cursor_size, &mouse_cursor_uv[0], &mouse_cursor_uv[2]);

    // Setup ImDrawData structures for end-user
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = 0;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataBuilder.FlattenIntoSingleLayer();

        // Draw software mouse cursor if requested by io.MouseDrawCursor flag
        // (note we scale cursor by current viewport/monitor, however Windows 10 for its own hardware cursor seems to be using a different scale factor)
        if (mouse_cursor_size.x > 0.0f && mouse_cursor_size.y > 0.0f)
        {
            float scale = g.Style.MouseCursorScale * viewport->DpiScale;
            if (viewport->GetMainRect().Overlaps(ImRect(g.IO.MousePos, g.IO.MousePos + ImVec2(mouse_cursor_size.x + 2, mouse_cursor_size.y + 2) * scale)))
                RenderMouseCursor(GetForegroundDrawList(viewport), g.IO.MousePos, scale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));
        }

        // Add foreground ImDrawList (for each active viewport)
        if (viewport->DrawLists[1] != NULL)
            AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[0], GetForegroundDrawList(viewport));

        SetupViewportDrawData(viewport, &viewport->DrawDataBuilder.Layers[0]);
        ImDrawData* draw_data = viewport->DrawData;
        g.IO.MetricsRenderVertices += draw_data->TotalVtxCount;
        g.IO.MetricsRenderIndices += draw_data->TotalIdxCount;
    }

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}